

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_Polyline2D(X3DImporter *this)

{
  float _x;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  CX3DImporter_NodeElement_Geometry2D *pCVar7;
  pointer paVar8;
  allocator local_109;
  string local_108;
  aiVector3t<float> local_e4;
  _Self local_d8;
  _Self local_d0;
  iterator it2;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tlist;
  undefined1 local_a8 [8];
  string an;
  uint local_74;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> lineSegments;
  string use;
  string def;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(use.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &lineSegments.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
              _M_impl._M_node._M_size);
  std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::list
            ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&ne);
  _idx_end = (CX3DImporter_NodeElement_Geometry2D *)0x0;
  local_74 = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_74 < iVar2; local_74 = local_74 + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_74);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_a8,(char *)CONCAT44(extraout_var,iVar3),
               (allocator *)
               ((long)&tlist.
                       super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl._M_node._M_size + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&tlist.
                       super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl._M_node._M_size + 7));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a8,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_74);
      std::__cxx11::string::operator=
                ((string *)(use.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar3));
      tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl._M_node
      ._M_size._0_4_ = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a8,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_74);
        std::__cxx11::string::operator=
                  ((string *)
                   &lineSegments.
                    super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                    ._M_node._M_size,(char *)CONCAT44(extraout_var_01,iVar3));
        tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        _M_node._M_size._0_4_ = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a8,"bboxCenter");
        if (bVar1) {
          tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          _M_node._M_size._0_4_ = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a8,"bboxSize");
          if (bVar1) {
            tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            _M_node._M_size._0_4_ = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a8,"containerField");
            if (bVar1) {
              tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
              ._M_node._M_size._0_4_ = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a8,"lineSegments");
              if (bVar1) {
                XML_ReadNode_GetAttrVal_AsListVec2f
                          (this,local_74,
                           (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&ne);
                tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl._M_node._M_size._0_4_ = 4;
              }
              else {
                Throw_IncorrectAttr(this,(string *)local_a8);
                tlist.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl._M_node._M_size._0_4_ = 0;
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_a8);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)
                                 &lineSegments.
                                  super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                  ._M_impl._M_node._M_size,ENET_Polyline2D,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)
                              &lineSegments.
                               super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                               ._M_impl._M_node._M_size);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    pCVar7 = (CX3DImporter_NodeElement_Geometry2D *)operator_new(0x78);
    CX3DImporter_NodeElement_Geometry2D::CX3DImporter_NodeElement_Geometry2D
              (pCVar7,ENET_Polyline2D,this->NodeElement_Cur);
    _idx_end = pCVar7;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,
                 (string *)(use.field_2._M_local_buf + 8));
    }
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::list
              ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it2);
    local_d0._M_node =
         (_List_node_base *)
         std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::begin
                   ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&ne);
    while( true ) {
      local_d8._M_node =
           (_List_node_base *)
           std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::end
                     ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&ne);
      bVar1 = std::operator!=(&local_d0,&local_d8);
      if (!bVar1) break;
      paVar8 = std::_List_iterator<aiVector2t<float>_>::operator->(&local_d0);
      _x = paVar8->x;
      paVar8 = std::_List_iterator<aiVector2t<float>_>::operator->(&local_d0);
      aiVector3t<float>::aiVector3t(&local_e4,_x,paVar8->y,0.0);
      std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it2,&local_e4);
      std::_List_iterator<aiVector2t<float>_>::operator++(&local_d0);
    }
    GeometryHelper_Extend_PointToLine
              (this,(list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it2,
               &_idx_end->Vertices);
    _idx_end->NumIndices = 2;
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar7 = _idx_end;
    if ((uVar4 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_108,"Polyline2D",&local_109);
      ParseNode_Metadata(this,&pCVar7->super_CX3DImporter_NodeElement,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~list
              ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&it2);
  }
  std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::~list
            ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&ne);
  std::__cxx11::string::~string
            ((string *)
             &lineSegments.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
              _M_impl._M_node._M_size);
  std::__cxx11::string::~string((string *)(use.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_Polyline2D()
{
    std::string def, use;
    std::list<aiVector2D> lineSegments;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("lineSegments", lineSegments, XML_ReadNode_GetAttrVal_AsListVec2f);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Polyline2D, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_Polyline2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		//
		// convert read point list of geometry object to line set.
		//
		std::list<aiVector3D> tlist;

		// convert vec2 to vec3
		for(std::list<aiVector2D>::iterator it2 = lineSegments.begin(); it2 != lineSegments.end(); ++it2) tlist.push_back(aiVector3D(it2->x, it2->y, 0));

		// convert point set to line set
		GeometryHelper_Extend_PointToLine(tlist, ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices);
		((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 2;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Polyline2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}